

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kdtree.c
# Opt level: O0

void free_kd_tree(kd_tree_t *tree)

{
  uint uVar1;
  uint local_14;
  uint32 n;
  uint32 i;
  kd_tree_t *tree_local;
  
  if (tree != (kd_tree_t *)0x0) {
    uVar1 = (1 << ((byte)tree->n_level & 0x1f)) - 1;
    for (local_14 = 0; local_14 < uVar1; local_14 = local_14 + 1) {
      ckd_free(tree->nodes[uVar1].bbi);
    }
    ckd_free(tree->nodes);
    ckd_free(tree);
  }
  return;
}

Assistant:

void
free_kd_tree(kd_tree_t * tree)
{
    uint32 i, n;

    if (tree == NULL)
        return;
    /* Balanced binary trees, so we have 2^level-1 nodes. */
    n = (1 << tree->n_level) - 1;
    for (i = 0; i < n; ++i)
        ckd_free(tree->nodes[n].bbi);
    ckd_free(tree->nodes);
    ckd_free(tree);
}